

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  int iVar1;
  pointer peVar2;
  pointer piVar3;
  bool bVar4;
  int32_t iVar5;
  pointer piVar6;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __i;
  pointer peVar7;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __it;
  const_iterator __last;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __first;
  long lVar8;
  entry *this_01;
  pointer peVar9;
  long lVar10;
  int64_t tl_local;
  int64_t t_local;
  int64_t *local_50;
  int64_t *local_48;
  int64_t *local_40;
  int64_t *local_38;
  
  peVar9 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  tl_local = tl;
  t_local = t;
  if (peVar9 != peVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
              (peVar9,peVar2,(int)LZCOUNT(((long)peVar2 - (long)peVar9) / 0x48) * 2 ^ 0x7e);
    if ((long)peVar2 - (long)peVar9 < 0x481) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar9,peVar2);
    }
    else {
      peVar7 = peVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar9,peVar7);
      for (; peVar7 != peVar2; peVar7 = peVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                  (peVar7);
      }
    }
  }
  __last._M_current =
       (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __it._M_current =
       (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
       super__Vector_impl_data._M_start;
  this_00 = &this->words_;
  local_48 = &tl_local;
  local_50 = &t_local;
  lVar10 = (long)__last._M_current - (long)__it._M_current;
  local_40 = local_50;
  local_38 = local_48;
  for (lVar8 = lVar10 / 0x48 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,__it
                      );
    __first._M_current = __it._M_current;
    if (bVar4) goto LAB_001249ed;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,
                       __it._M_current + 1);
    __first._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_001249ed;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,
                       __it._M_current + 2);
    __first._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_001249ed;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,
                       __it._M_current + 3);
    __first._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_001249ed;
    __it._M_current = __it._M_current + 4;
    lVar10 = lVar10 + -0x120;
  }
  lVar10 = lVar10 / 0x48;
  if (lVar10 == 1) {
LAB_001249cb:
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,__it
                      );
    __first._M_current = __it._M_current;
    if (!bVar4) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar10 == 2) {
LAB_001249b6:
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,__it
                      );
    __first._M_current = __it._M_current;
    if (!bVar4) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001249cb;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar10 != 3) goto LAB_00124a31;
    bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
            operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_50,__it
                      );
    __first._M_current = __it._M_current;
    if (!bVar4) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001249b6;
    }
  }
LAB_001249ed:
  if (__first._M_current != __last._M_current) {
    this_01 = __first._M_current;
    while (__first._M_current = __first._M_current + 1, __first._M_current != __last._M_current) {
      bVar4 = __gnu_cxx::__ops::_Iter_pred<fasttext::Dictionary::threshold(long,long)::$_1>::
              operator()((_Iter_pred<fasttext::Dictionary::threshold(long,long)::__1> *)&local_40,
                         __first);
      if (!bVar4) {
        entry::operator=(this_01,__first._M_current);
        this_01 = this_01 + 1;
      }
    }
    __last._M_current =
         (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = this_01;
  }
LAB_00124a31:
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
            (this_00,(const_iterator)__first._M_current,__last);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_shrink_to_fit(this_00);
  this->size_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  piVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    *piVar6 = -1;
  }
  for (peVar9 = (this_00->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                _M_impl.super__Vector_impl_data._M_start;
      peVar9 != (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_finish; peVar9 = peVar9 + 1) {
    iVar5 = find(this,&peVar9->word);
    iVar1 = this->size_;
    this->size_ = iVar1 + 1;
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar5] = iVar1;
    if (peVar9->type == label) {
      this->nlabels_ = this->nlabels_ + 1;
    }
    else if (peVar9->type == word) {
      this->nwords_ = this->nwords_ + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}